

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O2

cueify_msf_t cueify_full_toc_get_track_address(cueify_full_toc *t,uint8_t track)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (((t == (cueify_full_toc *)0x0) || (track < *(byte *)((long)t + 2))) ||
     (*(byte *)((long)t + 3) < track)) {
    bVar2 = 0;
    bVar3 = 0;
    bVar4 = 0;
  }
  else {
    lVar1 = (ulong)track * 9;
    bVar2 = *(byte *)((long)t + lVar1 + 10);
    bVar3 = *(byte *)((long)t + lVar1 + 0xb);
    bVar4 = *(byte *)((long)t + lVar1 + 0xc);
  }
  return (cueify_msf_t)((uint3)bVar2 | (uint3)bVar3 << 8 | (uint3)bVar4 << 0x10);
}

Assistant:

cueify_msf_t cueify_full_toc_get_track_address(cueify_full_toc *t,
					       uint8_t track) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t zero;

    zero.min = 0;
    zero.sec = 0;
    zero.frm = 0;

    if (toc == NULL) {
	return zero;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].offset;
    } else {
	return zero;
    }
}